

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTSoundBank_GetState(FACTSoundBank *pSoundBank,uint32_t *pdwState)

{
  uint32_t uVar1;
  long lVar2;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *pdwState = 0;
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    *pdwState = 4;
    if (pSoundBank->cueCount != 0) {
      lVar2 = 0;
      do {
        if ((&pSoundBank->cues->instanceCount)[lVar2] != '\0') {
          *pdwState = 0x84;
          break;
        }
        lVar2 = lVar2 + 0x14;
      } while ((ulong)pSoundBank->cueCount * 0x14 != lVar2);
    }
    FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t FACTSoundBank_GetState(
	FACTSoundBank *pSoundBank,
	uint32_t *pdwState
) {
	uint16_t i;
	if (pSoundBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pSoundBank->cueCount; i += 1)
	{
		if (pSoundBank->cues[i].instanceCount > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pSoundBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}